

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::SetLayerZreference
          (ChElementShellReissner4 *this,double z_from_bottom)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  pointer pdVar3;
  double *pdVar4;
  ulong uVar5;
  size_t kl;
  long lVar6;
  double dVar7;
  double local_40;
  double z_from_bottom_local;
  
  this->tot_thickness = 0.0;
  pLVar1 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar4 = &pLVar1->m_thickness;
  dVar7 = 0.0;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pLVar2 - (long)pLVar1) / 0x28); uVar5 = uVar5 + 1) {
    dVar7 = dVar7 + *pdVar4;
    pdVar4 = pdVar4 + 5;
    this->tot_thickness = dVar7;
  }
  pdVar3 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &this->m_layers_z;
  if ((this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  z_from_bottom_local = z_from_bottom;
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&z_from_bottom_local);
  lVar6 = 3;
  for (uVar5 = 0;
      pLVar1 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->m_layers).
                             super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x28);
      uVar5 = uVar5 + 1) {
    local_40 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5] + (double)(&pLVar1->m_element)[lVar6];
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_40);
    lVar6 = lVar6 + 5;
  }
  return;
}

Assistant:

void ChElementShellReissner4::SetLayerZreference(double z_from_bottom) {
    // accumulate element thickness.
    tot_thickness = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        tot_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the z levels of layers, by centering them
    m_layers_z.clear();
    m_layers_z.push_back(z_from_bottom);
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers_z.push_back(m_layers_z[kl] + m_layers[kl].Get_thickness());
    }
}